

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord3d *value)

{
  bool bVar1;
  ostream *poVar2;
  vector<double,_std::allocator<double>_> values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string msg;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream ss_e;
  
  bVar1 = Expect(this,'(');
  if (!bVar1) {
    return false;
  }
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = SepBy1BasicType<double>(this,',',&values);
  if ((bVar1) && (bVar1 = Expect(this,')'), bVar1)) {
    if ((long)values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 0x18) {
      value->s = *values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      value->t = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
      value->r = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
      bVar1 = true;
      goto LAB_002bb8dc;
    }
    ::std::__cxx11::to_string(&local_1e8,3);
    ::std::operator+(&local_1c8,"The number of tuple elements must be ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8
                    );
    ::std::operator+(&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                     ,", but got ");
    std::__cxx11::to_string
              (&local_208,
               (long)values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248
                     ,&local_208);
    ::std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e
                     ,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadBasicType");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x9ba);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&msg);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_248);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    ::std::__cxx11::string::_M_dispose();
  }
  bVar1 = false;
LAB_002bb8dc:
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&values.super__Vector_base<double,_std::allocator<double>_>);
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord3d *value) {
  if (!Expect('(')) {
    return false;
  }

  std::vector<double> values;
  if (!SepBy1BasicType<double>(',', &values)) {
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  if (values.size() != 3) {
    std::string msg = "The number of tuple elements must be " +
                      std::to_string(3) + ", but got " +
                      std::to_string(values.size()) + "\n";
    PUSH_ERROR_AND_RETURN(msg);
  }

  value->s = values[0];
  value->t = values[1];
  value->r = values[2];

  return true;
}